

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

bool rsg::AtanOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  bool bVar2;
  
  bVar2 = outMin <= 1.0 && -1.0 <= outMax;
  if (bVar2) {
    if (outMin <= -1.0) {
      outMin = -1.0;
    }
    fVar1 = tanf(outMin);
    *inMin = fVar1;
    if (1.0 <= outMax) {
      outMax = 1.0;
    }
    fVar1 = tanf(outMax);
    *inMax = fVar1;
  }
  return bVar2;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		// \note For accuracy reasons output range is limited to -1..1
		const float rangeMin = -1.0f;
		const float rangeMax = +1.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false; // Out of range

		inMin = deFloatTan(deFloatMax(outMin, rangeMin));
		inMax = deFloatTan(deFloatMin(outMax, rangeMax));

		return true;
	}